

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int usage(char *prog,int level)

{
  undefined1 local_15b8 [8];
  field_s nim_fields [63];
  field_s nhdr_fields_1 [47];
  field_s nhdr_fields [43];
  int local_20;
  int len;
  int c;
  int level_local;
  char *prog_local;
  
  if (level == 1) {
    fprintf(_stdout,"usage %s [options] -infiles files...\n",prog);
    fprintf(_stdout,"usage %s -help\n",prog);
    prog_local._4_4_ = -1;
  }
  else {
    if (level == 2) {
      use_full("nifti_tool");
    }
    else if (level == 3) {
      for (local_20 = 0; local_20 < 0x1d; local_20 = local_20 + 1) {
        fputs(g_history[local_20],_stdout);
      }
    }
    else if (level == 4) {
      fill_hdr_field_array((field_s *)(nhdr_fields_1[0x2e].name + 0x10));
      disp_field_s_list("nifti_1_header: ",(field_s *)(nhdr_fields_1[0x2e].name + 0x10),0x2b);
    }
    else if (level == 6) {
      fill_ana_field_array((field_s *)(nim_fields[0x3e].name + 0x10));
      disp_field_s_list("nifti_analyze75: ",(field_s *)(nim_fields[0x3e].name + 0x10),0x2f);
    }
    else if (level == 5) {
      fill_nim_field_array((field_s *)local_15b8);
      disp_field_s_list("nifti_image: ",(field_s *)local_15b8,0x3f);
    }
    else {
      if (level != 8) {
        fprintf(_stdout,"** illegal level for usage(): %d\n",(ulong)(uint)level);
        return -1;
      }
      fprintf(_stdout,"%s, %s\n",prog,g_version);
    }
    prog_local._4_4_ = 1;
  }
  return prog_local._4_4_;
}

Assistant:

int usage(char * prog, int level)
{
   int c, len;
   if( level == USE_SHORT )
   {
      fprintf(stdout,"usage %s [options] -infiles files...\n", prog);
      fprintf(stdout,"usage %s -help\n", prog);
      return -1;
   }
   else if( level == USE_FULL )
      use_full("nifti_tool");  /* let's not allow paths in here */
   else if( level == USE_HIST )
   {
      len = sizeof(g_history)/sizeof(char *);
      for( c = 0; c < len; c++)
          fputs(g_history[c], stdout);
   }
   else if( level == USE_FIELD_HDR )
   {
      field_s nhdr_fields[NT_HDR_NUM_FIELDS];  /* just do it all here */

      fill_hdr_field_array(nhdr_fields);
      disp_field_s_list("nifti_1_header: ", nhdr_fields, NT_HDR_NUM_FIELDS);
   }
   else if( level == USE_FIELD_ANA )
   {
      field_s nhdr_fields[NT_ANA_NUM_FIELDS];  /* just do it all here */

      fill_ana_field_array(nhdr_fields);
      disp_field_s_list("nifti_analyze75: ",nhdr_fields,NT_ANA_NUM_FIELDS);
   }
   else if( level == USE_FIELD_NIM )
   {
      field_s nim_fields[NT_NIM_NUM_FIELDS];

      fill_nim_field_array(nim_fields);
      disp_field_s_list("nifti_image: ", nim_fields, NT_NIM_NUM_FIELDS);
   }
   else if( level == USE_VERSION )
      fprintf(stdout, "%s, %s\n", prog, g_version);
   else {
      fprintf(stdout,"** illegal level for usage(): %d\n", level);
      return -1;
   }

   return 1;
}